

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O1

bool __thiscall QHostAddressPrivate::parse(QHostAddressPrivate *this,QString *ipString)

{
  QArrayData *pQVar1;
  QChar *pQVar2;
  char cVar3;
  CutResult CVar4;
  qsizetype qVar5;
  QArrayData *pQVar6;
  long lVar7;
  QChar *pQVar8;
  long in_FS_OFFSET;
  QStringView QVar9;
  quint32 maybeIp4;
  QArrayData *local_88;
  QChar *pQStack_80;
  QArrayData *local_78;
  QString local_68;
  qsizetype local_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this->protocol = -1;
  local_78 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  local_88 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pQStack_80 = (QChar *)&DAT_aaaaaaaaaaaaaaaa;
  QString::simplified_helper((QString *)&local_88);
  if (local_78 == (QArrayData *)0x0) {
    cVar3 = '\0';
  }
  else {
    local_68.d.d = (Data *)local_78;
    local_68.d.ptr = &pQStack_80->ucs;
    qVar5 = QStringView::indexOf((QStringView *)&local_68,(QChar)0x3a,0,CaseSensitive);
    pQVar1 = local_78;
    pQVar2 = pQStack_80;
    if (qVar5 != -1) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      QVar9.m_data = &pQStack_80->ucs;
      QVar9.m_size = (qsizetype)local_78;
      pQVar6 = (QArrayData *)QtPrivate::lastIndexOf(QVar9,-1,L'%',CaseSensitive);
      if (pQVar6 == (QArrayData *)0xffffffffffffffff) {
        pQVar6 = pQVar1;
        if ((this->scopeId).d.ptr != (char16_t *)0x0) {
          pQVar1 = &((this->scopeId).d.d)->super_QArrayData;
          (this->scopeId).d.d = (Data *)0x0;
          (this->scopeId).d.ptr = (char16_t *)0x0;
          (this->scopeId).d.size = 0;
          if (pQVar1 != (QArrayData *)0x0) {
            LOCK();
            (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar1,2,0x10);
            }
          }
        }
      }
      else {
        local_68.d.d = (Data *)((long)&(pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1);
        local_50 = -1;
        CVar4 = QtPrivate::QContainerImplHelper::mid
                          ((qsizetype)pQVar1,(qsizetype *)&local_68,&local_50);
        if (CVar4 == Null) {
          qVar5 = 0;
          pQVar8 = (QChar *)0x0;
        }
        else {
          pQVar8 = pQVar2 + (long)local_68.d.d;
          qVar5 = local_50;
        }
        QString::QString(&local_68,pQVar8,qVar5);
        pQVar1 = &((this->scopeId).d.d)->super_QArrayData;
        pQVar8 = (QChar *)(this->scopeId).d.ptr;
        (this->scopeId).d.d = local_68.d.d;
        (this->scopeId).d.ptr = local_68.d.ptr;
        qVar5 = (this->scopeId).d.size;
        (this->scopeId).d.size = local_68.d.size;
        local_68.d.d = (Data *)pQVar1;
        local_68.d.ptr = (char16_t *)pQVar8;
        local_68.d.size = qVar5;
        if (pQVar1 != (QArrayData *)0x0) {
          LOCK();
          (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar1,2,0x10);
          }
        }
      }
      lVar7 = QIPAddressUtils::parseIp6((unsigned_char *)&local_48,pQVar2,pQVar2 + (long)pQVar6);
      if (lVar7 == 0) {
        this->protocol = '\x01';
        (this->field_1).a6_64.c[0] = (quint64)local_48;
        (this->field_1).a6_64.c[1] = (quint64)puStack_40;
        this->a = 0;
        convertToIpv4(&this->a,&(this->field_1).a6,(ConversionMode)0x5);
        cVar3 = '\x01';
        goto LAB_001ad502;
      }
    }
    local_68.d.d = (Data *)((ulong)local_68.d.d & 0xffffffff00000000);
    cVar3 = QIPAddressUtils::parseIp4((uint *)&local_68,pQStack_80,pQStack_80 + (long)local_78);
    if (cVar3 != '\0') {
      this->a = (uint)local_68.d.d;
      this->protocol = '\0';
      (this->field_1).a6_64.c[0] = 0;
      if ((uint)local_68.d.d == 0) {
        (this->field_1).a6_64.c[1] = 0;
      }
      else {
        (this->field_1).a6_32.c[2] = 0xffff0000;
        (this->field_1).a6_32.c[3] =
             (uint)local_68.d.d >> 0x18 | ((uint)local_68.d.d & 0xff0000) >> 8 |
             ((uint)local_68.d.d & 0xff00) << 8 | (uint)local_68.d.d << 0x18;
      }
    }
  }
LAB_001ad502:
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (bool)cVar3;
}

Assistant:

bool QHostAddressPrivate::parse(const QString &ipString)
{
    protocol = QHostAddress::UnknownNetworkLayerProtocol;
    QString a = ipString.simplified();
    if (a.isEmpty())
        return false;

    // All IPv6 addresses contain a ':', and may contain a '.'.
    if (a.contains(u':')) {
        quint8 maybeIp6[16];
        if (parseIp6(a, maybeIp6, &scopeId)) {
            setAddress(maybeIp6);
            return true;
        }
    }

    quint32 maybeIp4 = 0;
    if (QIPAddressUtils::parseIp4(maybeIp4, a.constBegin(), a.constEnd())) {
        setAddress(maybeIp4);
        return true;
    }

    return false;
}